

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c02d::CpuTest_nop0c_abs_Test::TestBody(CpuTest_nop0c_abs_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  int iVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar6;
  pointer *__ptr;
  char cVar7;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_98;
  code *local_88;
  int *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [8];
  MatcherBase<unsigned_short> local_60;
  MatcherBase<unsigned_short> local_48;
  
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'\f');
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 2;
  this_00 = &(this->super_CpuTest).mmu;
  uVar2 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,uVar2 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x244,"mmu","read_byte(registers.pc + 1)");
  local_78 = (int *)operator_new(4);
  *local_78 = 0xcd;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_70,local_78);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *local_78;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_98,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  pCVar1 = &(this->super_CpuTest).registers;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  uVar3 = pCVar1->pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,uVar3 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x245,"mmu","read_byte(registers.pc + 2)");
  local_78 = (int *)operator_new(4);
  *local_78 = 0xef;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_70,local_78);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar4 = *local_78;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar4;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar4;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_98,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  cVar7 = '\x04';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&(this->super_CpuTest).expected,pCVar1);
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x248,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_98._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_98._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, nop0c_abs) {
    stage_instruction(NOP_ABS0C);
    expected.pc += 2;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0xEF));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}